

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall
LoopCrosser::CellCrossesAnySubcell(LoopCrosser *this,S2ClippedShape *a_clipped,S2CellId b_id)

{
  bool bVar1;
  int iVar2;
  int i_00;
  S2Point *a0;
  S2Point *a1;
  reference ppSVar3;
  S2ClippedShape *b_clipped;
  S2ShapeIndexCell *b_cell;
  iterator __end2;
  iterator __begin2;
  vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_> *__range2;
  int local_98;
  int aj;
  int i;
  int a_num_edges;
  undefined1 local_88 [8];
  S2PaddedCell b_root;
  S2ClippedShape *a_clipped_local;
  LoopCrosser *this_local;
  S2CellId b_id_local;
  
  b_root._88_8_ = a_clipped;
  S2PaddedCell::S2PaddedCell((S2PaddedCell *)local_88,b_id,0.0);
  iVar2 = S2ClippedShape::num_edges((S2ClippedShape *)b_root._88_8_);
  local_98 = 0;
  do {
    if (iVar2 <= local_98) {
      return false;
    }
    i_00 = S2ClippedShape::edge((S2ClippedShape *)b_root._88_8_,local_98);
    a0 = S2Loop::vertex(this->a_,i_00);
    a1 = S2Loop::vertex(this->a_,i_00 + 1);
    S2CrossingEdgeQuery::GetCells(&this->b_query_,a0,a1,(S2PaddedCell *)local_88,&this->b_cells_);
    bVar1 = std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::empty
                      (&this->b_cells_);
    if (!bVar1) {
      StartEdge(this,i_00);
      __end2 = std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::
               begin(&this->b_cells_);
      b_cell = (S2ShapeIndexCell *)
               std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::end
                         (&this->b_cells_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
                                         *)&b_cell), bVar1) {
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
                  ::operator*(&__end2);
        b_clipped = S2ShapeIndexCell::clipped(*ppSVar3,0);
        bVar1 = EdgeCrossesCell(this,b_clipped);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_S2ShapeIndexCell_**,_std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>_>
        ::operator++(&__end2);
      }
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

bool LoopCrosser::CellCrossesAnySubcell(const S2ClippedShape& a_clipped,
                                        S2CellId b_id) {
  // Test all edges of "a_clipped" against all edges of B.  The relevant B
  // edges are guaranteed to be children of "b_id", which lets us find the
  // correct index cells more efficiently.
  S2PaddedCell b_root(b_id, 0);
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    int aj = a_clipped.edge(i);
    // Use an S2CrossingEdgeQuery starting at "b_root" to find the index cells
    // of B that might contain crossing edges.
    b_query_.GetCells(a_.vertex(aj), a_.vertex(aj+1), b_root, &b_cells_);
    if (b_cells_.empty()) continue;
    StartEdge(aj);
    for (const S2ShapeIndexCell* b_cell : b_cells_) {
      if (EdgeCrossesCell(b_cell->clipped(0))) return true;
    }
  }
  return false;
}